

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool util::compareString(string *str1,char *str2)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = str1->_M_string_length;
  sVar6 = strlen(str2);
  if (uVar1 == sVar6) {
    bVar8 = uVar1 == 0;
    if (!bVar8) {
      pcVar2 = (str1->_M_dataplus)._M_p;
      iVar4 = tolower((int)*pcVar2);
      iVar5 = tolower((int)*str2);
      if (iVar4 == iVar5) {
        uVar3 = 1;
        do {
          uVar7 = uVar3;
          if (uVar1 == uVar7) break;
          iVar4 = tolower((int)pcVar2[uVar7]);
          iVar5 = tolower((int)str2[uVar7]);
          uVar3 = uVar7 + 1;
        } while (iVar4 == iVar5);
        bVar8 = uVar1 <= uVar7;
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool util::compareString(const string &str1, const char* str2){
    if(str1.size() != strlen(str2))
        return false;
    for(int i = 0; i < str1.size(); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}